

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::copyNSolveSolution(MLABecLaplacian *this,MultiFab *dst,MultiFab *src)

{
  int iVar1;
  bool bVar2;
  FabArrayBase *in_RSI;
  FabArrayBase *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *m;
  Array4<const_double> *sfab;
  Array4<double> *dfab;
  Box *bx;
  MFIter mfi;
  int ncomp;
  nullptr_t in_stack_fffffffffffffce8;
  PCData<amrex::FArrayBox> *i_00;
  MFIter *in_stack_fffffffffffffcf0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd20;
  int iVar3;
  undefined4 in_stack_fffffffffffffd24;
  int iVar4;
  int local_2d8;
  int local_2d4;
  MFIter *in_stack_fffffffffffffd50;
  long local_290;
  long local_288;
  long local_280;
  int local_270;
  int local_26c;
  int local_268;
  long *local_250;
  undefined1 local_248 [136];
  MFIter *local_1c0;
  undefined1 local_1b4 [36];
  MFIter local_190;
  int local_12c;
  MultiArray4<double> local_120;
  MFIter *local_110;
  int local_108;
  PCData<amrex::FArrayBox> *local_100;
  int local_f4;
  int iStack_f0;
  int local_ec;
  Long local_e8;
  int local_e0;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> local_d8;
  int local_cc;
  int iStack_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  FabArray<amrex::FArrayBox> *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  MFIter *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  MFIter *local_80;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined4 local_3c;
  Long *local_38;
  undefined4 local_2c;
  PCData<amrex::FArrayBox> *local_28;
  undefined4 local_1c;
  PCData<amrex::FArrayBox> *local_18;
  undefined4 local_c;
  PCData<amrex::FArrayBox> *local_8;
  
  local_120.hp = (Array4<double> *)in_RSI;
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8);
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::back((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
          *)in_stack_fffffffffffffcf0);
  bVar2 = std::operator==((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                          in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (!bVar2) {
    local_12c = FabArrayBase::nComp((FabArrayBase *)local_120.hp);
    TilingIfNotGPU();
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),in_RDI,
                   (bool)local_120.hp._7_1_);
    while (bVar2 = MFIter::isValid(&local_190), bVar2) {
      i_00 = (PCData<amrex::FArrayBox> *)local_1b4;
      MFIter::tilebox(in_stack_fffffffffffffd50);
      in_stack_fffffffffffffcf0 = (MFIter *)(local_248 + 0x48);
      local_1b4._28_8_ = i_00;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      in_stack_fffffffffffffcf8 = (FabArray<amrex::FArrayBox> *)local_248;
      local_1c0 = in_stack_fffffffffffffcf0;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      local_248._64_8_ = in_stack_fffffffffffffcf8;
      Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffffcf0,(size_type)i_00);
      std::
      vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::back((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              *)in_stack_fffffffffffffcf0);
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x12cfb43);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      local_100 = (PCData<amrex::FArrayBox> *)local_1b4._28_8_;
      local_8 = (PCData<amrex::FArrayBox> *)local_1b4._28_8_;
      local_c = 0;
      local_f4 = *(int *)(_Alloc_hider *)local_1b4._28_8_;
      local_18 = (PCData<amrex::FArrayBox> *)local_1b4._28_8_;
      local_1c = 1;
      iStack_f0 = *(int *)((_Alloc_hider *)local_1b4._28_8_ + 4);
      in_stack_fffffffffffffd50 = *(MFIter **)(_Alloc_hider *)local_1b4._28_8_;
      local_28 = (PCData<amrex::FArrayBox> *)local_1b4._28_8_;
      local_2c = 2;
      local_108 = *(int *)(local_1b4._28_8_ + 8);
      local_d8._M_head_impl = (PCData<amrex::FArrayBox> *)local_1b4._28_8_;
      local_38 = (Long *)((long)(local_1b4._28_8_ + 8) + 4);
      local_3c = 0;
      local_cc = *(int *)local_38;
      local_48 = (undefined1 *)((long)(local_1b4._28_8_ + 8) + 4);
      local_4c = 1;
      iStack_c8 = *(int *)(local_1b4._28_8_ + 0x10);
      local_e8 = *local_38;
      local_58 = (undefined1 *)((long)(local_1b4._28_8_ + 8) + 4);
      local_5c = 2;
      local_e0 = *(int *)(local_1b4._28_8_ + 0x14);
      for (local_2d4 = 0; local_2d8 = local_108, local_2d4 < local_12c; local_2d4 = local_2d4 + 1) {
        for (; iVar4 = iStack_f0, local_2d8 <= local_e0; local_2d8 = local_2d8 + 1) {
          for (; iVar1 = local_f4, iVar4 <= iStack_c8; iVar4 = iVar4 + 1) {
            while (iVar3 = iVar1, iVar3 <= local_cc) {
              local_74 = local_2d8;
              if (*(int *)(local_290 +
                          ((long)(iVar3 - local_270) + (iVar4 - local_26c) * local_288 +
                          (local_2d8 - local_268) * local_280) * 4) == 0) {
                local_98 = local_1c0;
                local_a4 = local_2d8;
                local_a8 = local_2d4;
                *(undefined8 *)
                 ((long)&((local_1c0->m_fa)._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                         _vptr_FabArrayBase +
                 ((long)(iVar3 - local_1c0->currentIndex) +
                  (long)(iVar4 - local_1c0->beginIndex) * (long)local_1c0->fabArray +
                  (long)(local_2d8 - local_1c0->endIndex) * *(long *)(local_1c0->tile_size).vect +
                 (long)local_2d4 * *(long *)((local_1c0->tile_size).vect + 2)) * 8) = 0;
                local_a0 = iVar4;
                local_9c = iVar3;
              }
              else {
                local_b0 = (FabArray<amrex::FArrayBox> *)local_248._64_8_;
                local_bc = local_2d8;
                local_c0 = local_2d4;
                local_80 = local_1c0;
                local_8c = local_2d8;
                local_90 = local_2d4;
                *(undefined8 *)
                 ((long)&((local_1c0->m_fa)._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                         _vptr_FabArrayBase +
                 ((long)(iVar3 - local_1c0->currentIndex) +
                  (long)(iVar4 - local_1c0->beginIndex) * (long)local_1c0->fabArray +
                  (long)(local_2d8 - local_1c0->endIndex) * *(long *)(local_1c0->tile_size).vect +
                 (long)local_2d4 * *(long *)((local_1c0->tile_size).vect + 2)) * 8) =
                     *(undefined8 *)
                      (*(long *)local_248._64_8_ +
                      ((long)(iVar3 - *(int *)(local_248._64_8_ + 0x20)) +
                       (long)(iVar4 - *(int *)(local_248._64_8_ + 0x24)) *
                       *(long *)&((BoxArray *)(local_248._64_8_ + 8))->m_bat +
                       (long)(local_2d8 - *(int *)(local_248._64_8_ + 0x28)) *
                       *(long *)(local_248._64_8_ + 0x10) +
                      (long)local_2d4 * *(long *)(local_248._64_8_ + 0x18)) * 8);
                local_b8 = iVar4;
                local_b4 = iVar3;
                local_88 = iVar4;
                local_84 = iVar3;
              }
              local_70 = iVar4;
              local_6c = iVar3;
              local_68 = &local_290;
              iVar1 = iVar3 + 1;
            }
          }
        }
      }
      local_250 = &local_290;
      local_110 = in_stack_fffffffffffffd50;
      local_ec = local_108;
      local_c4 = local_e0;
      MFIter::operator++(&local_190);
    }
    MFIter::~MFIter(in_stack_fffffffffffffcf0);
  }
  return;
}

Assistant:

void
MLABecLaplacian::copyNSolveSolution (MultiFab& dst, MultiFab const& src) const
{
    if (m_overset_mask[0].back() == nullptr) return;

    const int ncomp = dst.nComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& srcma = src.const_arrays();
        auto const& mma = m_overset_mask[0].back()->const_arrays();
        ParallelFor(dst, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (mma[box_no](i,j,k)) {
                dstma[box_no](i,j,k,n) = srcma[box_no](i,j,k,n);
            } else {
                dstma[box_no](i,j,k,n) = Real(0.0);
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi) {
            Box const& bx = mfi.tilebox();
            Array4<Real> const& dfab = dst.array(mfi);
            Array4<Real const> const& sfab = src.const_array(mfi);
            Array4<int const> const& m = m_overset_mask[0].back()->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                if (m(i,j,k)) {
                    dfab(i,j,k,n) = sfab(i,j,k,n);
                } else {
                    dfab(i,j,k,n) = Real(0.0);
                }
            });
        }
    }
}